

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-timed.c
# Opt level: O1

_Bool mon_set_timed(monster *mon,wchar_t effect_type,wchar_t timer,wchar_t flag)

{
  byte *pbVar1;
  short sVar2;
  wchar_t flag_00;
  monster_race *race;
  player_upkeep *ppVar3;
  bool bVar4;
  _Bool _Var5;
  _Bool _Var6;
  uint32_t uVar7;
  monster_lore *lore;
  int iVar8;
  wchar_t wVar9;
  int iVar10;
  wchar_t local_44;
  
  if (mon == (monster *)0x0) {
    __assert_fail("mon != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0x8a,"_Bool mon_set_timed(struct monster *, int, int, int)");
  }
  race = mon->race;
  if (race == (monster_race *)0x0) {
    __assert_fail("mon->race != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0x8b,"_Bool mon_set_timed(struct monster *, int, int, int)");
  }
  if (timer < L'\0') {
    __assert_fail("timer >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0x8e,"_Bool mon_set_timed(struct monster *, int, int, int)");
  }
  sVar2 = mon->m_timed[(uint)effect_type];
  wVar9 = (wchar_t)sVar2;
  if (effects[(uint)effect_type].max_timer < timer) {
    timer = effects[(uint)effect_type].max_timer;
  }
  if (timer == wVar9) {
    return false;
  }
  if (timer == L'\0') {
    local_44 = effects[(uint)effect_type].message_end;
    flag = flag | 1;
    if (effect_type == L'\b') {
      (mon->target).midx = L'\0';
    }
    bVar4 = false;
  }
  else {
    if (sVar2 == 0) {
      local_44 = effects[(uint)effect_type].message_begin;
      flag = flag | 1;
    }
    else {
      bVar4 = false;
      if (timer <= wVar9) {
        local_44 = L'\0';
        goto LAB_00178afe;
      }
      local_44 = effects[(uint)effect_type].message_increase;
    }
    bVar4 = true;
  }
LAB_00178afe:
  if ((bVar4) && (lore = get_lore(race), (flag & 8U) == 0)) {
    flag_00 = effects[(uint)effect_type].flag_resist;
    _Var5 = flag_has_dbg(mon->race->flags,0xb,flag_00,"mon->race->flags","effect->flag_resist");
    if (_Var5) {
      lore_learn_flag_if_visible(lore,mon,flag_00);
LAB_00178b6a:
      local_44 = L'\b';
      _Var5 = false;
      goto LAB_00178c10;
    }
    if (effects[(uint)effect_type].gets_save == true) {
      iVar8 = 0;
      if (timer < L'2') {
        iVar8 = 0x19 - timer / 2;
      }
      iVar8 = iVar8 + mon->race->level;
      iVar10 = 0x5a;
      if (iVar8 < 0x5a) {
        iVar10 = iVar8;
      }
      _Var5 = monster_is_unique(mon);
      if ((_Var5) && (uVar7 = Rand_div(100), (int)uVar7 < iVar10)) goto LAB_00178b6a;
      uVar7 = Rand_div(100);
      if ((int)uVar7 < iVar10) {
        local_44 = L'\b';
        _Var5 = false;
        goto LAB_00178c10;
      }
    }
  }
  mon->m_timed[(uint)effect_type] = (int16_t)timer;
  _Var5 = true;
LAB_00178c10:
  if (effect_type == L'\t') {
    if (wVar9 < timer) {
      _Var6 = monster_change_shape((monster_conflict *)mon);
      if (!_Var6) {
        mon->m_timed[(uint)effect_type] = sVar2;
        local_44 = L'+';
      }
    }
    else if ((timer == L'\0') && (_Var6 = monster_revert_shape((monster_conflict *)mon), !_Var6)) {
      quit("Monster shapechange reversion failed!");
    }
  }
  if ((((flag & 5U) == 1) && (local_44 != L'\0')) && (_Var6 = monster_is_obvious(mon), _Var6)) {
    add_monster_message((monster_conflict *)mon,local_44,true);
  }
  if (_Var5 != false) {
    ppVar3 = player->upkeep;
    if (ppVar3->health_who == mon) {
      pbVar1 = (byte *)((long)&ppVar3->redraw + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    pbVar1 = (byte *)((long)&ppVar3->redraw + 2);
    *pbVar1 = *pbVar1 | 0x40;
  }
  return _Var5;
}

Assistant:

static bool mon_set_timed(struct monster *mon,
		int effect_type,
		int timer,
		int flag)
{
	assert(mon != NULL);
	assert(mon->race != NULL);
	assert(effect_type >= 0);
	assert(effect_type < MON_TMD_MAX);
	assert(timer >= 0);

	struct mon_timed_effect *effect = &effects[effect_type];

	bool check_resist;
	bool resisted = false;
	bool update = false;

	int m_note = 0;
	int old_timer = mon->m_timed[effect_type];

	/* Limit time of effect */
	if (timer > effect->max_timer) {
		timer = effect->max_timer;
	}

	/* No change */
	if (old_timer == timer) {
		return false;
	} else if (timer == 0) {
		/* Turning off, usually mention */
		m_note = effect->message_end;
		flag |= MON_TMD_FLG_NOTIFY;
		check_resist = false;

		/* When monster command by player (Necromancer power) expires,
		* don't leave stale monster -> monster target */
		if (effect_type == MON_TMD_COMMAND) {
			mon->target.midx = 0;
		}
	} else if (old_timer == 0) {
		/* Turning on, usually mention */
		m_note = effect->message_begin;
		flag |= MON_TMD_FLG_NOTIFY;
		check_resist = true;
	} else if (timer > old_timer) {
		/* Different message for increases, but don't automatically mention. */
		m_note = effect->message_increase;
		check_resist = true;
	} else {
		/* Decreases don't get a message, but never resist them */
		check_resist = false;
	}

	/* Determine if the monster resisted or not, if appropriate */
	if (check_resist && does_resist(mon, effect_type, timer, flag)) {
		resisted = true;
		m_note = MON_MSG_UNAFFECTED;
	} else {
		mon->m_timed[effect_type] = timer;
		update = true;
	}

	/* Special case - deal with monster shapechanges */
	if (effect_type == MON_TMD_CHANGED) {
		if (timer > old_timer) {
			if (!monster_change_shape(mon)) {
				m_note = MON_MSG_SHAPE_FAIL;
				mon->m_timed[effect_type] = old_timer;
			}
		} else if (timer == 0) {
			if (!monster_revert_shape(mon)) {
				quit ("Monster shapechange reversion failed!");
			}
		}
	}

	/* Print a message if there is one, if the effect allows for it, and if
	 * either the monster is visible, or we're trying to ID something */
	if (m_note &&
		!(flag & MON_TMD_FLG_NOMESSAGE) &&
		(flag & MON_TMD_FLG_NOTIFY)
		&& monster_is_obvious(mon)) {
			add_monster_message(mon, m_note, true);
	}

	/* Update the visuals, as appropriate. */
	if (update) {
		if (player->upkeep->health_who == mon)
			player->upkeep->redraw |= (PR_HEALTH);

		player->upkeep->redraw |= (PR_MONLIST);
	}

	return !resisted;
}